

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

Point3f * phyr::offsetRayOrigin(Point3f *p,Normal3f *n,Vector3f *w,Vector3f *fpError)

{
  double *pdVar1;
  Vector3<double> *in_RCX;
  Normal3<double> *in_RDX;
  Normal3<double> *in_RDI;
  Vector3<double> *in_R8;
  double dVar2;
  int i;
  Vector3f offset;
  double d;
  Vector3<double> *in_stack_ffffffffffffff48;
  Point3<double> *in_stack_ffffffffffffff50;
  int delta;
  double in_stack_ffffffffffffff58;
  Normal3<double> *this;
  int local_8c;
  Vector3<double> local_70;
  Vector3<double> local_58;
  Normal3<double> local_40;
  double local_28;
  Vector3<double> *local_20;
  Vector3<double> *local_18;
  Normal3<double> *local_10;
  
  this = in_RDI;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  abs<double>(in_RDI);
  local_28 = dot<double>(&local_40,local_20);
  local_28 = local_28 * 1024.0;
  Vector3<double>::Vector3(&local_70,local_10);
  Vector3<double>::operator*
            ((Vector3<double> *)in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
  dVar2 = dot<double>(local_18,local_10);
  if (dVar2 < 0.0) {
    Vector3<double>::operator-((Vector3<double> *)in_stack_ffffffffffffff50);
  }
  Point3<double>::operator+(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
    pdVar1 = Vector3<double>::operator[](&local_58,local_8c);
    if (*pdVar1 <= 0.0) {
      pdVar1 = Vector3<double>::operator[](&local_58,local_8c);
      delta = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      if (*pdVar1 <= 0.0 && *pdVar1 != 0.0) {
        Point3<double>::operator[]((Point3<double> *)this,local_8c);
        in_stack_ffffffffffffff50 = (Point3<double> *)nextFloatDown(in_stack_ffffffffffffff58,delta)
        ;
        pdVar1 = Point3<double>::operator[]((Point3<double> *)this,local_8c);
        *pdVar1 = (double)in_stack_ffffffffffffff50;
      }
    }
    else {
      Point3<double>::operator[]((Point3<double> *)this,local_8c);
      in_stack_ffffffffffffff58 =
           nextFloatUp(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      pdVar1 = Point3<double>::operator[]((Point3<double> *)this,local_8c);
      *pdVar1 = in_stack_ffffffffffffff58;
    }
  }
  return (Point3f *)in_RDI;
}

Assistant:

inline Point3f offsetRayOrigin(const Point3f& p, const Normal3f& n,
                               const Vector3f& w, const Vector3f& fpError) {
    Real d = dot(abs(n), fpError);
#ifdef PHYRAY_USE_LONG_P
    d *= 1024;  // Use higher ulps factor for double
#endif

    Vector3f offset = Vector3f(n) * d;
    if (dot(w, n) < 0) offset = -offset;
    Point3f op = p + offset;

    // Round indiviual components up or down depending on the sign
    for (int i = 0; i < 3; i++) {
        if (offset[i] > 0) op[i] = nextFloatUp(op[i]);
        else if (offset[i] < 0) op[i] = nextFloatDown(op[i]);
    }

    return op;
}